

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O2

void rcg::getColor(uint8_t *rgb,shared_ptr<const_rcg::Image> *img,uint32_t ds,uint32_t i,uint32_t k)

{
  element_type *peVar1;
  uint64_t uVar2;
  uint8_t uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  byte *pbVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  uint uVar12;
  uint8_t *puVar13;
  uint uVar14;
  bool bVar15;
  uint8_t v [3];
  uint8_t v_1 [3];
  byte local_56;
  byte local_55;
  byte local_54;
  byte local_53;
  byte local_52;
  byte local_51;
  uint local_50;
  uint local_4c;
  ulong local_48;
  uint8_t *local_40;
  long local_38;
  
  local_4c = ds + (ds == 0);
  local_48 = (ulong)(i * local_4c);
  uVar8 = (ulong)(k * local_4c);
  peVar1 = (img->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar2 = peVar1->pixelformat;
  local_40 = rgb;
  if (uVar2 == 0x2180014) {
    lVar5 = peVar1->width * 3 + peVar1->xpadding;
    pbVar7 = (byte *)((ulong)(i * local_4c * 3) +
                     uVar8 * lVar5 +
                     (long)(peVar1->pixel)._M_t.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                     );
    uVar10 = 0;
    uVar12 = 0;
    uVar4 = 0;
    for (uVar14 = 0; pbVar11 = pbVar7, uVar9 = local_4c, uVar14 != local_4c; uVar14 = uVar14 + 1) {
      while (uVar9 != 0) {
        uVar10 = uVar10 + *pbVar11;
        uVar12 = uVar12 + pbVar11[1];
        uVar4 = uVar4 + pbVar11[2];
        pbVar11 = pbVar11 + 3;
        uVar9 = uVar9 - 1;
      }
      pbVar7 = pbVar7 + lVar5;
    }
    local_4c = local_4c * local_4c;
    *rgb = (uint8_t)(uVar10 / local_4c);
    rgb[1] = (uint8_t)(uVar12 / local_4c);
  }
  else {
    if (uVar2 == 0x20c005a) {
      local_38 = (peVar1->width >> 2) * 6 + peVar1->xpadding;
      puVar13 = (uint8_t *)
                (uVar8 * local_38 +
                (long)(peVar1->pixel)._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                );
      uVar10 = 0;
      uVar12 = 0;
      uVar4 = 0;
      for (local_50 = 0; local_50 != local_4c; local_50 = local_50 + 1) {
        uVar8 = local_48 & 0xffffffff;
        uVar14 = local_4c;
        while (bVar15 = uVar14 != 0, uVar14 = uVar14 - 1, bVar15) {
          convYCbCr411toRGB(&local_53,puVar13,(int)uVar8);
          uVar10 = uVar10 + local_53;
          uVar12 = uVar12 + local_52;
          uVar4 = uVar4 + local_51;
          uVar8 = (ulong)((int)uVar8 + 1);
        }
        puVar13 = puVar13 + local_38;
      }
    }
    else {
      if ((uVar2 != 0x2100032) && (uVar2 != 0x210003b)) {
        if (uVar2 != 0x1080001) {
          return;
        }
        lVar5 = peVar1->xpadding + peVar1->width;
        lVar6 = local_48 +
                uVar8 * lVar5 +
                (long)(peVar1->pixel)._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
        ;
        uVar4 = 0;
        for (uVar10 = 0; uVar10 != local_4c; uVar10 = uVar10 + 1) {
          for (uVar8 = 0; local_4c != uVar8; uVar8 = uVar8 + 1) {
            uVar4 = uVar4 + *(byte *)(lVar6 + uVar8);
          }
          lVar6 = lVar6 + lVar5;
        }
        uVar3 = (uint8_t)(uVar4 / (local_4c * local_4c));
        *rgb = uVar3;
        rgb[1] = uVar3;
        goto LAB_0011cbc3;
      }
      local_38 = (peVar1->width * 2 & 0xfffffffffffffff8) + peVar1->xpadding;
      puVar13 = (uint8_t *)
                (uVar8 * local_38 +
                (long)(peVar1->pixel)._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                );
      uVar10 = 0;
      uVar12 = 0;
      uVar4 = 0;
      for (local_50 = 0; local_50 != local_4c; local_50 = local_50 + 1) {
        uVar8 = local_48 & 0xffffffff;
        uVar14 = local_4c;
        while (bVar15 = uVar14 != 0, uVar14 = uVar14 - 1, bVar15) {
          convYCbCr422toRGB(&local_56,puVar13,(int)uVar8);
          uVar10 = uVar10 + local_56;
          uVar12 = uVar12 + local_55;
          uVar4 = uVar4 + local_54;
          uVar8 = (ulong)((int)uVar8 + 1);
        }
        puVar13 = puVar13 + local_38;
      }
    }
    local_4c = local_4c * local_4c;
    *local_40 = (uint8_t)(uVar10 / local_4c);
    local_40[1] = (uint8_t)(uVar12 / local_4c);
  }
  uVar3 = (uint8_t)(uVar4 / local_4c);
  rgb = local_40;
LAB_0011cbc3:
  rgb[2] = uVar3;
  return;
}

Assistant:

void getColor(uint8_t rgb[3], const std::shared_ptr<const Image> &img,
              uint32_t ds, uint32_t i, uint32_t k)
{
  if (ds < 1)
    ds = 1;

  i*=ds;
  k*=ds;

  if (img->getPixelFormat() == Mono8) // convert from monochrome
  {
    size_t lstep=img->getWidth()+img->getXPadding();
    const uint8_t *p=img->getPixels()+k*lstep+i;

    uint32_t g=0, n=0;

    for (uint32_t kk=0; kk<ds; kk++)
    {
      for (uint32_t ii=0; ii<ds; ii++)
      {
        g+=p[ii];
        n++;
      }

      p+=lstep;
    }

    rgb[2]=rgb[1]=rgb[0]=static_cast<uint8_t>(g/n);
  }
  else if (img->getPixelFormat() == RGB8) // convert from RGB8
  {
    size_t lstep=3*img->getWidth()+img->getXPadding();
    const uint8_t *p=img->getPixels()+k*lstep+3*i;

    uint32_t r=0;
    uint32_t g=0;
    uint32_t b=0;
    uint32_t n=0;

    for (uint32_t kk=0; kk<ds; kk++)
    {
      const uint8_t *pp=p;
      for (uint32_t ii=0; ii<ds; ii++)
      {
        r+=*pp++;
        g+=*pp++;
        b+=*pp++;
        n++;
      }

      p+=lstep;
    }

    rgb[0]=static_cast<uint8_t>(r/n);
    rgb[1]=static_cast<uint8_t>(g/n);
    rgb[2]=static_cast<uint8_t>(b/n);
  }
  else if (img->getPixelFormat() == YCbCr411_8) // convert from YUV411
  {
    size_t lstep=(img->getWidth()>>2)*6+img->getXPadding();
    const uint8_t *p=img->getPixels()+k*lstep;

    uint32_t r=0;
    uint32_t g=0;
    uint32_t b=0;
    uint32_t n=0;

    for (uint32_t kk=0; kk<ds; kk++)
    {
      for (uint32_t ii=0; ii<ds; ii++)
      {
        uint8_t v[3];
        convYCbCr411toRGB(v, p, static_cast<int>(i+ii));

        r+=v[0];
        g+=v[1];
        b+=v[2];
        n++;
      }

      p+=lstep;
    }

    rgb[0]=static_cast<uint8_t>(r/n);
    rgb[1]=static_cast<uint8_t>(g/n);
    rgb[2]=static_cast<uint8_t>(b/n);
  }
  else if (img->getPixelFormat() == YCbCr422_8 || img->getPixelFormat() == YUV422_8) // convert from YUV422
  {
    size_t lstep=(img->getWidth()>>2)*8+img->getXPadding();
    const uint8_t *p=img->getPixels()+k*lstep;

    uint32_t r=0;
    uint32_t g=0;
    uint32_t b=0;
    uint32_t n=0;

    for (uint32_t kk=0; kk<ds; kk++)
    {
      for (uint32_t ii=0; ii<ds; ii++)
      {
        uint8_t v[3];
        convYCbCr422toRGB(v, p, static_cast<int>(i+ii));

        r+=v[0];
        g+=v[1];
        b+=v[2];
        n++;
      }

      p+=lstep;
    }

    rgb[0]=static_cast<uint8_t>(r/n);
    rgb[1]=static_cast<uint8_t>(g/n);
    rgb[2]=static_cast<uint8_t>(b/n);
  }
}